

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbinaryast.cpp
# Opt level: O3

size_t __thiscall SQASTWriter::writeAST(SQASTWriter *this,RootBlock *root,SQChar *sourcename)

{
  OutputStream *pOVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  int i_1;
  int i;
  long lVar4;
  U64Conv conv;
  undefined8 local_88;
  SQASTWritingVisitor local_80;
  
  (*this->stream->_vptr_OutputStream[4])(this->stream,0);
  writeMagic(this);
  writeOptions(this);
  (*this->stream->_vptr_OutputStream[3])();
  local_80.stream = this->stream;
  local_80.stringTable.
  super_unordered_map<const_char_*,_unsigned_int,_SQASTWritingVisitor::str_hash,_SQASTWritingVisitor::eq_str,_StdArenaAllocator<std::pair<const_char_*const,_unsigned_int>_>_>
  ._M_h.
  super__Hashtable_alloc<StdArenaAllocator<std::__detail::_Hash_node<std::pair<const_char_*const,_unsigned_int>,_true>_>_>
  .
  super__Hashtable_ebo_helper<0,_StdArenaAllocator<std::__detail::_Hash_node<std::pair<const_char_*const,_unsigned_int>,_true>_>,_false>
  ._M_tp._arena =
       (_Hashtable_ebo_helper<0,_StdArenaAllocator<std::__detail::_Hash_node<std::pair<const_char_*const,_unsigned_int>,_true>_>,_false>
        )&this->arena;
  local_80.stringIndexes = &this->stringIndexes;
  local_80.stringTable.
  super_unordered_map<const_char_*,_unsigned_int,_SQASTWritingVisitor::str_hash,_SQASTWritingVisitor::eq_str,_StdArenaAllocator<std::pair<const_char_*const,_unsigned_int>_>_>
  ._M_h._M_buckets =
       &local_80.stringTable.
        super_unordered_map<const_char_*,_unsigned_int,_SQASTWritingVisitor::str_hash,_SQASTWritingVisitor::eq_str,_StdArenaAllocator<std::pair<const_char_*const,_unsigned_int>_>_>
        ._M_h._M_single_bucket;
  local_80.super_Visitor._vptr_Visitor = (_func_int **)&PTR__SQASTWritingVisitor_001a2538;
  local_80.stringTable.
  super_unordered_map<const_char_*,_unsigned_int,_SQASTWritingVisitor::str_hash,_SQASTWritingVisitor::eq_str,_StdArenaAllocator<std::pair<const_char_*const,_unsigned_int>_>_>
  ._M_h._M_bucket_count = 1;
  local_80.stringTable.
  super_unordered_map<const_char_*,_unsigned_int,_SQASTWritingVisitor::str_hash,_SQASTWritingVisitor::eq_str,_StdArenaAllocator<std::pair<const_char_*const,_unsigned_int>_>_>
  ._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_80.stringTable.
  super_unordered_map<const_char_*,_unsigned_int,_SQASTWritingVisitor::str_hash,_SQASTWritingVisitor::eq_str,_StdArenaAllocator<std::pair<const_char_*const,_unsigned_int>_>_>
  ._M_h._M_element_count = 0;
  local_80.stringTable.
  super_unordered_map<const_char_*,_unsigned_int,_SQASTWritingVisitor::str_hash,_SQASTWritingVisitor::eq_str,_StdArenaAllocator<std::pair<const_char_*const,_unsigned_int>_>_>
  ._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_80.stringTable.
  super_unordered_map<const_char_*,_unsigned_int,_SQASTWritingVisitor::str_hash,_SQASTWritingVisitor::eq_str,_StdArenaAllocator<std::pair<const_char_*const,_unsigned_int>_>_>
  ._M_h._M_rehash_policy._M_next_resize = 0;
  local_80.stringTable.
  super_unordered_map<const_char_*,_unsigned_int,_SQASTWritingVisitor::str_hash,_SQASTWritingVisitor::eq_str,_StdArenaAllocator<std::pair<const_char_*const,_unsigned_int>_>_>
  ._M_h._M_single_bucket = (__node_base_ptr)0x0;
  SQASTWritingVisitor::writeString(&local_80,sourcename);
  iVar2 = (*this->stream->_vptr_OutputStream[3])();
  pOVar1 = this->stream;
  local_88 = 0;
  lVar4 = 0;
  do {
    (**pOVar1->_vptr_OutputStream)(pOVar1,(ulong)*(byte *)((long)&local_88 + lVar4));
    lVar4 = lVar4 + 1;
  } while (lVar4 != 8);
  SQCompilation::Node::visit<SQASTWritingVisitor>((Node *)root,&local_80);
  iVar3 = (*this->stream->_vptr_OutputStream[3])();
  (*this->stream->_vptr_OutputStream[4])(this->stream,CONCAT44(extraout_var,iVar2));
  pOVar1 = this->stream;
  local_88 = CONCAT44(extraout_var_00,iVar3);
  lVar4 = 0;
  do {
    (**pOVar1->_vptr_OutputStream)(pOVar1,(ulong)*(byte *)((long)&local_88 + lVar4));
    lVar4 = lVar4 + 1;
  } while (lVar4 != 8);
  (*this->stream->_vptr_OutputStream[4])();
  writeStringTable(this);
  iVar2 = (*this->stream->_vptr_OutputStream[3])();
  memset(local_80.stringTable.
         super_unordered_map<const_char_*,_unsigned_int,_SQASTWritingVisitor::str_hash,_SQASTWritingVisitor::eq_str,_StdArenaAllocator<std::pair<const_char_*const,_unsigned_int>_>_>
         ._M_h._M_buckets,0,
         local_80.stringTable.
         super_unordered_map<const_char_*,_unsigned_int,_SQASTWritingVisitor::str_hash,_SQASTWritingVisitor::eq_str,_StdArenaAllocator<std::pair<const_char_*const,_unsigned_int>_>_>
         ._M_h._M_bucket_count << 3);
  return CONCAT44(extraout_var_01,iVar2);
}

Assistant:

size_t SQASTWriter::writeAST(RootBlock *root, const SQChar *sourcename) {
  stream->seek(0);

  writeMagic();

  assert(stream->pos() == sizeof(uint32_t));

  writeOptions();

  assert(stream->pos() == 2 * sizeof(uint32_t));

  size_t sourceNameOff = stream->pos();

  SQASTWritingVisitor writingVisitor(stream, &arena, stringIndexes);
  writingVisitor.writeString(sourcename);

  size_t stringTableOffsetOff = stream->pos();
  stream->writeRawUInt64(0);

  root->visit(&writingVisitor);

  size_t stringTableOff = stream->pos();

  stream->seek(stringTableOffsetOff);
  stream->writeRawUInt64(stringTableOff);

  stream->seek(stringTableOff);
  writeStringTable();

  return stream->pos();
}